

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateEnterExecutingModeComplete(HelicsFederate fed,HelicsError *err)

{
  Federate *pFVar1;
  HelicsFederate in_RSI;
  Federate *fedObj;
  Federate *in_stack_00000058;
  HelicsError *in_stack_ffffffffffffffe8;
  
  pFVar1 = getFed(in_RSI,in_stack_ffffffffffffffe8);
  if (pFVar1 != (Federate *)0x0) {
    helics::Federate::enterExecutingModeComplete(in_stack_00000058);
  }
  return;
}

Assistant:

void helicsFederateEnterExecutingModeComplete(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->enterExecutingModeComplete();
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}